

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O0

int StrListIndex(tchar_t *s,tchar_t *List)

{
  int iVar1;
  size_t n_00;
  int local_2c;
  int i;
  size_t n;
  tchar_t *List_local;
  tchar_t *s_local;
  
  if (((List != (tchar_t *)0x0) && (*List != '\0')) && (n_00 = strlen(s), n_00 != 0)) {
    local_2c = 0;
    n = (size_t)List;
    while (n != 0) {
      iVar1 = tcsnicmp_ascii((tchar_t *)n,s,n_00);
      if ((iVar1 == 0) &&
         (((*(char *)(n + n_00) == '\0' || (*(char *)(n + n_00) == ',')) ||
          (*(char *)(n + n_00) == ' ')))) {
        return local_2c;
      }
      n = (size_t)strchr((char *)n,0x2c);
      if ((char *)n != (char *)0x0) {
        n = n + 1;
      }
      local_2c = local_2c + 1;
    }
  }
  return -1;
}

Assistant:

int StrListIndex(const tchar_t* s, const tchar_t* List)
{
	if (List && *List)
	{
		size_t n = tcslen(s);
		if (n)
		{
			int i=0;
			while (List)
			{
				if (tcsnicmp_ascii(List,s,n)==0 && (!List[n] || List[n]==',' || List[n]==' '))
					return i;
				List = tcschr(List,T(','));
				if (List) ++List;
				++i;
			}
		}
	}
	return -1;
}